

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

auto_ptr<cmFunctionBlocker> __thiscall
cmMakefile::RemoveFunctionBlocker(cmMakefile *this,cmFunctionBlocker *fb,cmListFileFunction *lff)

{
  size_type sVar1;
  long lVar2;
  cmListFileFunction *pcVar3;
  char cVar4;
  ulong uVar5;
  ostream *poVar6;
  cmCommandContext *in_RCX;
  ulong uVar7;
  void *pvVar8;
  _Map_pointer ppbVar9;
  ulong uVar10;
  void *__src;
  long lVar11;
  cmListFileContext closingContext;
  ostringstream e;
  string local_210;
  cmListFileContext local_1f0;
  undefined1 local_1a8 [376];
  
  sVar1 = fb[8].StartingContext.FilePath.field_2._M_allocated_capacity;
  if (fb[8].StartingContext.FilePath._M_string_length == sVar1) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(ulong *)(sVar1 - 8);
  }
  sVar1 = fb[8].StartingContext.Name.field_2._M_allocated_capacity;
  lVar2 = *(long *)((long)&fb[8].StartingContext.Name.field_2 + 8);
  uVar10 = (long)(lVar2 - sVar1) >> 3;
  ppbVar9 = (_Map_pointer)0x0;
  lVar11 = 0;
  uVar7 = uVar10;
  do {
    if (uVar7 <= uVar5) goto LAB_0036824c;
    uVar7 = uVar7 - 1;
    pcVar3 = *(cmListFileFunction **)(lVar2 + -8 + lVar11);
    lVar11 = lVar11 + -8;
  } while (pcVar3 != lff);
  cVar4 = (**(code **)((pcVar3->super_cmCommandContext).Name._M_dataplus._M_p + 8))();
  if (cVar4 == '\0') {
    cmListFileContext::FromCommandContext(&local_1f0,in_RCX,(string *)&lff->Arguments);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"A logical block opening on the line\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
    poVar6 = operator<<((ostream *)local_1a8,
                        (cmListFileContext *)&(lff->super_cmCommandContext).Name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"closes on the line\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
    poVar6 = operator<<(poVar6,&local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"with mis-matching arguments.",0x1c);
    std::__cxx11::stringbuf::str();
    IssueMessage((cmMakefile *)fb,AUTHOR_WARNING,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.FilePath._M_dataplus._M_p != &local_1f0.FilePath.field_2) {
      operator_delete(local_1f0.FilePath._M_dataplus._M_p,
                      local_1f0.FilePath.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.Name._M_dataplus._M_p != &local_1f0.Name.field_2) {
      operator_delete(local_1f0.Name._M_dataplus._M_p,
                      local_1f0.Name.field_2._M_allocated_capacity + 1);
    }
  }
  lVar2 = sVar1 + uVar10 * 8;
  ppbVar9 = *(_Map_pointer *)(lVar2 + lVar11);
  __src = (void *)(lVar2 + lVar11 + 8);
  pvVar8 = *(void **)((long)&fb[8].StartingContext.Name.field_2 + 8);
  if (__src != pvVar8) {
    memmove((void *)(lVar2 + lVar11),__src,(long)pvVar8 + (-lVar11 - lVar2) + -8);
    pvVar8 = *(void **)((long)&fb[8].StartingContext.Name.field_2 + 8);
  }
  *(long *)((long)&fb[8].StartingContext.Name.field_2 + 8) = (long)pvVar8 + -8;
LAB_0036824c:
  (this->FindPackageModuleStack).
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = ppbVar9;
  return (auto_ptr<cmFunctionBlocker>)(cmFunctionBlocker *)this;
}

Assistant:

CM_AUTO_PTR<cmFunctionBlocker> cmMakefile::RemoveFunctionBlocker(
  cmFunctionBlocker* fb, const cmListFileFunction& lff)
{
  // Find the function blocker stack barrier for the current scope.
  // We only remove a blocker whose index is not less than the barrier.
  FunctionBlockersType::size_type barrier = 0;
  if (!this->FunctionBlockerBarriers.empty()) {
    barrier = this->FunctionBlockerBarriers.back();
  }

  // Search for the function blocker whose scope this command ends.
  for (FunctionBlockersType::size_type i = this->FunctionBlockers.size();
       i > barrier; --i) {
    std::vector<cmFunctionBlocker*>::iterator pos =
      this->FunctionBlockers.begin() + (i - 1);
    if (*pos == fb) {
      // Warn if the arguments do not match, but always remove.
      if (!(*pos)->ShouldRemove(lff, *this)) {
        cmListFileContext const& lfc = fb->GetStartingContext();
        cmListFileContext closingContext =
          cmListFileContext::FromCommandContext(lff, lfc.FilePath);
        std::ostringstream e;
        /* clang-format off */
        e << "A logical block opening on the line\n"
          << "  " << lfc << "\n"
          << "closes on the line\n"
          << "  " << closingContext << "\n"
          << "with mis-matching arguments.";
        /* clang-format on */
        this->IssueMessage(cmake::AUTHOR_WARNING, e.str());
      }
      cmFunctionBlocker* b = *pos;
      this->FunctionBlockers.erase(pos);
      return CM_AUTO_PTR<cmFunctionBlocker>(b);
    }
  }

  return CM_AUTO_PTR<cmFunctionBlocker>();
}